

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

size_t ssh_sendbuffer(Backend *be)

{
  size_t sVar1;
  Backend *local_28;
  size_t backlog;
  Ssh *ssh;
  Backend *be_local;
  
  if (((be + -3 == (Backend *)0x0) || (be[-3].vt == (BackendVtable *)0x0)) ||
     (be[0x19].interactor == (Interactor *)0x0)) {
    be_local = (Backend *)0x0;
  }
  else {
    local_28 = (Backend *)ssh_stdin_backlog((ConnectionLayer *)be[0x19].interactor);
    if (be[0x19].vt != (BackendVtable *)0x0) {
      sVar1 = ssh_ppl_queued_data_size((PacketProtocolLayer *)be[0x19].vt);
      local_28 = (Backend *)((long)&local_28->vt + sVar1);
    }
    if (((ulong)be[0xb].vt & 1) != 0) {
      local_28 = (Backend *)((long)&local_28->vt + (long)&(be[10].interactor)->vt);
    }
    be_local = local_28;
  }
  return (size_t)be_local;
}

Assistant:

static size_t ssh_sendbuffer(Backend *be)
{
    Ssh *ssh = container_of(be, Ssh, backend);
    size_t backlog;

    if (!ssh || !ssh->s || !ssh->cl)
        return 0;

    backlog = ssh_stdin_backlog(ssh->cl);

    if (ssh->base_layer)
        backlog += ssh_ppl_queued_data_size(ssh->base_layer);

    /*
     * If the SSH socket itself has backed up, add the total backup
     * size on that to any individual buffer on the stdin channel.
     */
    if (ssh->throttled_all)
        backlog += ssh->overall_bufsize;

    return backlog;
}